

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_zhao_2010.h
# Opt level: O2

void __thiscall SBLA::SecondScan(SBLA *this)

{
  uint *puVar1;
  char cVar2;
  long lVar3;
  Mat1i *pMVar4;
  char *pcVar5;
  int i;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  lVar3 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  for (lVar6 = 0; lVar6 < (long)this->N * (long)this->M; lVar6 = lVar6 + 1) {
    uVar7 = *(uint *)(lVar3 + lVar6 * 4);
    if ((int)uVar7 < 0) {
      do {
        uVar9 = -uVar7;
        uVar8 = *(uint *)(lVar3 + (ulong)uVar9 * 4);
        if (uVar7 == uVar8) break;
        uVar7 = uVar8;
      } while ((int)uVar8 < 0);
      if ((int)uVar8 < 0) {
        uVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
        (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar8;
        *(uint *)(lVar3 + (ulong)uVar9 * 4) = uVar8;
      }
      *(uint *)(lVar3 + lVar6 * 4) = uVar8;
    }
  }
  cVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74;
  if (cVar2 == '\0') goto LAB_001c6778;
  **(char **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x10 = cVar2;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  if (1 < this->N) {
    pcVar5 = *(char **)&pMVar4->field_0x10;
    cVar2 = pcVar5[1];
    if (cVar2 != '\0') {
      *pcVar5 = cVar2;
      goto LAB_001c6778;
    }
  }
  pcVar5 = *(char **)&pMVar4->field_0x10;
  if (1 < this->M) {
    lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    if (pcVar5[lVar3] != '\0') {
      *pcVar5 = pcVar5[lVar3];
      goto LAB_001c6778;
    }
    if ((1 < this->N) && (pcVar5[lVar3 + 1] != '\0')) {
      *pcVar5 = pcVar5[lVar3 + 1];
      goto LAB_001c6778;
    }
  }
  *pcVar5 = '\x01';
LAB_001c6778:
  puVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void SecondScan()
    {
        // Label assignment
        int *img_labelsdata = reinterpret_cast<int*>(img_labels_.data);
        for (int i = 0; i < M * N; ++i) {
            // FindRoot_GetLabel
            int pos = img_labelsdata[i];
            if (pos >= 0)
                continue;

            int tmp;
            while (true) {
                tmp = img_labelsdata[-pos];
                if (pos == tmp || tmp >= 0)
                    break;
                pos = tmp;
            }
            if (tmp < 0)
                img_labelsdata[-pos] = ++n_labels_;

            // Assign final label
            img_labelsdata[i] = img_labelsdata[-pos];
        }

        // Fix for first pixel!
        if (firstpixel) {
            const_cast<cv::Mat1b&>(img_).data[0] = firstpixel;
            if (N > 1 && img_labels_.data[1])
                img_labels_.data[0] = img_labels_.data[1];
            else if (M > 1 && img_labels_.data[img_.step[0]])
                img_labels_.data[0] = img_labels_.data[img_.step[0]];
            else if (N > 1 && M > 1 && img_labels_.data[img_.step[0] + 1])
                img_labels_.data[0] = img_labels_.data[img_.step[0] + 1];
            else
                img_labels_.data[0] = 1;
        }

        n_labels_++; // To count also background
    }